

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O0

qcc_stream_data
qcc_stream_data_process
          (qcc_stream_data data,qcc_arena *arena,qcc_stream_node *begin,qcc_stream_node *end,
          qcc_stream_data_process_fn proc)

{
  qcc_stream_data qVar1;
  int iVar2;
  qcc_stream_node *node_00;
  bool local_81;
  qcc_stream_node *copy;
  qcc_uint qStack_70;
  uint skip;
  qcc_uint value;
  qcc_stream_node *node;
  uint is_changed;
  uint in_range;
  qcc_stream_data result;
  qcc_stream_data_process_fn proc_local;
  qcc_stream_node *end_local;
  qcc_stream_node *begin_local;
  qcc_arena *arena_local;
  qcc_stream_data data_local;
  qcc_stream_node *local_10;
  
  local_10 = data.last;
  data_local.last = data.first;
  result.last = (qcc_stream_node *)proc;
  qcc_stream_data_init((qcc_stream_data *)&is_changed);
  node._4_4_ = 0;
  node._0_4_ = 0;
  value = (qcc_uint)data_local.last;
  do {
    if (value == 0) {
      if ((uint)node != 0) {
        data_local.last = _is_changed;
        local_10 = result.first;
      }
      qVar1.last = local_10;
      qVar1.first = data_local.last;
      return qVar1;
    }
    if ((qcc_stream_node *)value == begin) {
      node._4_4_ = 1;
    }
    if ((qcc_stream_node *)value == end) {
      node._4_4_ = 0;
    }
    qStack_70 = *(qcc_uint *)(value + 8);
    if (node._4_4_ == 0) {
LAB_001045cd:
      node_00 = (qcc_stream_node *)qcc_arena_alloc(arena,0x10);
      node_00->value = qStack_70;
      qcc_stream_data_push_back((qcc_stream_data *)&is_changed,node_00);
    }
    else {
      iVar2 = (*(code *)result.last)(&stack0xffffffffffffff90);
      local_81 = true;
      if (iVar2 == 0) {
        local_81 = qStack_70 != *(qcc_uint *)(value + 8);
      }
      node._0_4_ = (uint)local_81;
      if (iVar2 == 0) goto LAB_001045cd;
    }
    value = *(qcc_uint *)value;
  } while( true );
}

Assistant:

struct qcc_stream_data
qcc_stream_data_process(struct qcc_stream_data data, struct qcc_arena *arena,
                        const struct qcc_stream_node *begin,
                        const struct qcc_stream_node *end,
                        qcc_stream_data_process_fn proc)
{
    struct qcc_stream_data result;
    qcc_stream_data_init(&result);

    unsigned in_range = 0;
    unsigned is_changed = 0;
    for (struct qcc_stream_node *node = data.first; node; node = node->next)
    {
        if (node == begin) in_range = 1;
        if (node == end) in_range = 0;

        qcc_uint value = node->value;
        if (in_range)
        {
            unsigned skip = proc(&value);
            is_changed = skip || (value != node->value);
            if (skip) continue;
        }

        QCC_ARENA_POD(arena, qcc_stream_node, copy);
        copy->value = value;
        qcc_stream_data_push_back(&result, copy);
    }

    return is_changed ? result : data;
}